

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

err_t rngESHealth2(void)

{
  bool bVar1;
  err_t eVar2;
  err_t eVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = false;
  lVar4 = 0;
  do {
    eVar2 = rngESTest((&PTR_anon_var_dwarf_3ee2_00174d70)[lVar4]);
    if (eVar2 == 0) break;
    lVar4 = 1;
    bVar1 = !bVar5;
    bVar5 = true;
  } while (bVar1);
  eVar3 = 0x12f;
  if (eVar2 == 0) {
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

err_t rngESHealth2()
{
	const char* sources[] = { "trng", "trng2" };
	size_t pos;
	// проверить физические источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESTest(sources[pos]) == ERR_OK)
			return ERR_OK;
	// работоспособные источники не найдены
	return ERR_NOT_ENOUGH_ENTROPY;
}